

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O1

int __thiscall EDLines::ComputeMinLineLength(EDLines *this)

{
  double dVar1;
  double dVar2;
  
  dVar1 = log10((double)(this->super_ED).width);
  dVar2 = log10((double)(this->super_ED).height);
  dVar1 = round((((dVar2 + dVar1) * -2.0) / -0.9030899869919435) * 0.5);
  return (int)dVar1;
}

Assistant:

int EDLines::ComputeMinLineLength() {
	// The reason we are dividing the theoretical minimum line length by 2 is because
	// we now test short line segments by a line support region rectangle having width=2.
	// This means that within a line support region rectangle for a line segment of length "l" 
	// there are "2*l" many pixels. Thus, a line segment of length "l" has a chance of getting
	// validated by NFA.

	double logNT = 2.0*(log10((double)width) + log10((double)height));
	return (int) round((-logNT / log10(0.125))*0.5);
}